

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,int *x,int ncat,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator,
                 vector<double,_std::allocator<double>_> *w)

{
  pointer pdVar1;
  size_t row;
  long lVar2;
  allocator_type local_59;
  double *local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> buffer_cnt;
  
  local_50 = 0.0;
  local_58 = buffer_prob;
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_cnt,(long)(ncat + 1),&local_50,&local_59);
  pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (; st <= end; st = st + 1) {
    lVar2 = (long)x[ix_arr[st]];
    if ((long)x[ix_arr[st]] < 0) {
      lVar2 = (long)ncat;
    }
    buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar2] =
         pdVar1[ix_arr[st]] +
         buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar2];
  }
  local_58 = (double *)
             calc_kurtosis_weighted_internal<std::vector<double,std::allocator<double>>,double>
                       ((vector<double,_std::allocator<double>_> *)
                        &buffer_cnt.super__Vector_base<double,_std::allocator<double>_>,x,ncat,
                        local_58,missing_action,cat_split_type,rnd_generator,w);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&buffer_cnt.super__Vector_base<double,_std::allocator<double>_>);
  return (double)local_58;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, int x[], int ncat, double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator,
                              mapping &restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        w_this = w[ix_arr[row]];
        if (likely(x[ix_arr[row]] >= 0))
            buffer_cnt[x[ix_arr[row]]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<mapping, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}